

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O0

int cook_loclists_contents(Dwarf_Debug dbg,Dwarf_Loc_Head_c llhead,Dwarf_Error *error)

{
  Dwarf_Unsigned error_00;
  Dwarf_Loc_Head_c dbg_00;
  char *msg;
  undefined1 local_98 [8];
  dwarfstring m;
  Dwarf_Addr targaddr_2;
  Dwarf_Addr targaddr_1;
  Dwarf_Addr targaddr;
  Dwarf_Locdesc_c_conflict llc;
  uint local_50;
  Dwarf_Bool debug_addr_fail;
  Dwarf_Bool base_address_fail;
  int res;
  Dwarf_CU_Context cucontext;
  Dwarf_Unsigned i;
  Dwarf_Unsigned count;
  Dwarf_Unsigned baseaddress;
  Dwarf_Error *error_local;
  Dwarf_Loc_Head_c llhead_local;
  Dwarf_Debug dbg_local;
  
  count = llhead->ll_cu_base_address;
  i = llhead->ll_locdesc_count;
  _base_address_fail = llhead->ll_context;
  debug_addr_fail = 0;
  llc._4_4_ = 0;
  local_50 = (uint)(llhead->ll_cu_base_address_present == 0);
  baseaddress = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)llhead;
  llhead_local = (Dwarf_Loc_Head_c)dbg;
  for (cucontext = (Dwarf_CU_Context)0x0; cucontext < i;
      cucontext = (Dwarf_CU_Context)((long)&cucontext->cc_dbg + 1)) {
    targaddr = (long)*error_local + (long)cucontext * 0x98;
    switch(*(undefined1 *)(targaddr + 2)) {
    case 0:
      break;
    case 1:
      targaddr_1 = 0;
      if (llc._4_4_ == 0) {
        debug_addr_fail =
             _dwarf_look_in_local_and_tied_by_index
                       ((Dwarf_Debug)llhead_local,_base_address_fail,
                        *(Dwarf_Unsigned *)(targaddr + 0x18),&targaddr_1,(Dwarf_Error *)baseaddress)
        ;
      }
      else {
        debug_addr_fail = -1;
      }
      if (debug_addr_fail == 0) {
        local_50 = 0;
        count = targaddr_1;
        *(Dwarf_Addr *)(targaddr + 0x20) = targaddr_1;
      }
      else {
        llc._4_4_ = 1;
        local_50 = 1;
        *(undefined4 *)(targaddr + 4) = 1;
        *(undefined8 *)(targaddr + 0x20) = 0;
        if ((debug_addr_fail == 1) && (baseaddress != 0)) {
          dwarf_dealloc_error((Dwarf_Debug)llhead_local,*(Dwarf_Error *)baseaddress);
          *(undefined8 *)baseaddress = 0;
        }
      }
      break;
    case 2:
      targaddr_2 = 0;
      if (llc._4_4_ == 0) {
        debug_addr_fail =
             _dwarf_look_in_local_and_tied_by_index
                       ((Dwarf_Debug)llhead_local,_base_address_fail,
                        *(Dwarf_Unsigned *)(targaddr + 0x18),&targaddr_2,(Dwarf_Error *)baseaddress)
        ;
      }
      else {
        debug_addr_fail = -1;
      }
      if (debug_addr_fail == 0) {
        *(Dwarf_Addr *)(targaddr + 0x20) = targaddr_2;
      }
      else {
        llc._4_4_ = 1;
        *(undefined4 *)(targaddr + 4) = 1;
        *(undefined8 *)(targaddr + 0x20) = 0;
        if ((debug_addr_fail == 1) && (baseaddress != 0)) {
          dwarf_dealloc_error((Dwarf_Debug)llhead_local,*(Dwarf_Error *)baseaddress);
          *(undefined8 *)baseaddress = 0;
        }
      }
      if (llc._4_4_ == 0) {
        debug_addr_fail =
             _dwarf_look_in_local_and_tied_by_index
                       ((Dwarf_Debug)llhead_local,_base_address_fail,
                        *(Dwarf_Unsigned *)(targaddr + 0x28),&targaddr_2,(Dwarf_Error *)baseaddress)
        ;
      }
      else {
        debug_addr_fail = -1;
      }
      if (debug_addr_fail == 0) {
        *(Dwarf_Addr *)(targaddr + 0x30) = targaddr_2;
      }
      else {
        llc._4_4_ = 1;
        *(undefined4 *)(targaddr + 4) = 1;
        *(undefined8 *)(targaddr + 0x30) = 0;
        if ((debug_addr_fail == 1) && (baseaddress != 0)) {
          dwarf_dealloc_error((Dwarf_Debug)llhead_local,*(Dwarf_Error *)baseaddress);
          *(undefined8 *)baseaddress = 0;
        }
      }
      break;
    case 3:
      m.s_malloc = '\0';
      m._25_7_ = 0;
      if (llc._4_4_ == 0) {
        debug_addr_fail =
             _dwarf_look_in_local_and_tied_by_index
                       ((Dwarf_Debug)llhead_local,_base_address_fail,
                        *(Dwarf_Unsigned *)(targaddr + 0x18),(Dwarf_Addr *)&m.s_malloc,
                        (Dwarf_Error *)baseaddress);
      }
      else {
        debug_addr_fail = -1;
      }
      if (debug_addr_fail == 0) {
        *(undefined8 *)(targaddr + 0x20) = m._24_8_;
        *(long *)(targaddr + 0x30) = m._24_8_ + *(long *)(targaddr + 0x28);
      }
      else {
        llc._4_4_ = 1;
        *(undefined4 *)(targaddr + 4) = 1;
        *(undefined8 *)(targaddr + 0x20) = 0;
        if ((debug_addr_fail == 1) && (baseaddress != 0)) {
          dwarf_dealloc_error((Dwarf_Debug)llhead_local,*(Dwarf_Error *)baseaddress);
          *(undefined8 *)baseaddress = 0;
        }
      }
      break;
    case 4:
      if (local_50 == 0) {
        *(Dwarf_Unsigned *)(targaddr + 0x20) = *(long *)(targaddr + 0x18) + count;
        *(Dwarf_Unsigned *)(targaddr + 0x30) = *(long *)(targaddr + 0x28) + count;
      }
      else {
        *(undefined4 *)(targaddr + 4) = 1;
        *(undefined8 *)(targaddr + 0x20) = 0;
        *(undefined8 *)(targaddr + 0x30) = 0;
      }
      break;
    case 5:
      break;
    case 6:
      *(undefined8 *)(targaddr + 0x20) = *(undefined8 *)(targaddr + 0x18);
      *(undefined8 *)(targaddr + 0x30) = *(undefined8 *)(targaddr + 0x18);
      count = *(Dwarf_Unsigned *)(targaddr + 0x18);
      local_50 = 0;
      break;
    case 7:
      *(undefined8 *)(targaddr + 0x20) = *(undefined8 *)(targaddr + 0x18);
      *(undefined8 *)(targaddr + 0x30) = *(undefined8 *)(targaddr + 0x28);
      break;
    case 8:
      *(undefined8 *)(targaddr + 0x20) = *(undefined8 *)(targaddr + 0x18);
      *(long *)(targaddr + 0x30) = *(long *)(targaddr + 0x18) + *(long *)(targaddr + 0x28);
      break;
    default:
      dwarfstring_constructor((dwarfstring_s *)local_98);
      dwarfstring_append_printf_u
                ((dwarfstring *)local_98,
                 "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code of 0x%x is unknown. DWARF5 loclists error"
                 ,(ulong)*(byte *)(targaddr + 2));
      dbg_00 = llhead_local;
      error_00 = baseaddress;
      msg = dwarfstring_string((dwarfstring_s *)local_98);
      _dwarf_error_string((Dwarf_Debug)dbg_00,(Dwarf_Error *)error_00,0x1d5,msg);
      dwarfstring_destructor((dwarfstring_s *)local_98);
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
cook_loclists_contents(Dwarf_Debug dbg,
    Dwarf_Loc_Head_c llhead,
    Dwarf_Error *error)
{
    Dwarf_Unsigned baseaddress = llhead->ll_cu_base_address;
    Dwarf_Unsigned count = llhead->ll_locdesc_count;
    Dwarf_Unsigned i = 0;
    Dwarf_CU_Context cucontext = llhead->ll_context;
    int res = 0;
    Dwarf_Bool base_address_fail = FALSE;
    Dwarf_Bool debug_addr_fail = FALSE;

    if (!llhead->ll_cu_base_address_present) {
        base_address_fail = TRUE;
    }
    for (i = 0 ; i < count ; ++i) {
        Dwarf_Locdesc_c  llc = 0;

        llc = llhead->ll_locdesc +i;
        switch(llc->ld_lle_value) {
        case DW_LLE_base_addressx: {
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                base_address_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                base_address_fail = FALSE;
                baseaddress = targaddr;
                llc->ld_lopc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_endx:{
            /* two indexes into debug_addr */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
            }
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawhigh,&targaddr,
                    error);

            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_highpc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_highpc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_length:{
            /* one index to debug_addr other a length */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else  {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
                llc->ld_highpc = targaddr + llc->ld_rawhigh;
            }
            break;
        }
        case DW_LLE_offset_pair:{
            if (base_address_fail) {
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                llc->ld_highpc = 0;
            } else {
                /*offsets of the current base address*/
                llc->ld_lopc = llc->ld_rawlow +baseaddress;
                llc->ld_highpc = llc->ld_rawhigh +baseaddress;
            }
            break;
        }
        case DW_LLE_default_location:{
            /*  nothing to do here, just has a counted
                location description */
            break;
        }
        case DW_LLE_base_address:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow;
            baseaddress = llc->ld_rawlow;
            base_address_fail = FALSE;
            break;
        }
        case DW_LLE_start_end:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawhigh;
            break;
        }
        case DW_LLE_start_length:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow + llc->ld_rawhigh;
            break;
        }
        case DW_LLE_end_of_list:{
            /* do nothing */
            break;
        }
        default: {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code "
                "of 0x%x is unknown. DWARF5 loclists error",
                llc->ld_lle_value);
            _dwarf_error_string(dbg,error,
                DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
    }
    return DW_DLV_OK;
}